

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O2

void __thiscall Varnode::printCover(Varnode *this,ostream *s)

{
  ostream *poVar1;
  LowlevelError *this_00;
  allocator local_39;
  string local_38;
  
  if (this->cover == (Cover *)0x0) {
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string((string *)&local_38,"No cover to print",&local_39);
    LowlevelError::LowlevelError(this_00,&local_38);
    __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if ((this->flags & 0x2000000) == 0) {
    Cover::print(this->cover,s);
    return;
  }
  poVar1 = std::operator<<(s,"Cover is dirty");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Varnode::printCover(ostream &s) const

{
  if (cover == (Cover *)0)
    throw LowlevelError("No cover to print");
  if ((flags & Varnode::coverdirty)!=0)
    s << "Cover is dirty" << endl;
  else
    cover->print(s);
}